

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  SQObjectPtrVec *this_00;
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQExceptionTrap *pSVar3;
  SQObjectPtr *pSVar4;
  undefined8 uVar5;
  SQObjectValue this_01;
  SQExceptionTrap *pSVar6;
  long lVar7;
  undefined8 uVar8;
  SQWeakRef *x;
  SQInteger n;
  long lVar9;
  char *s;
  SQInteger i;
  long lVar10;
  SQUnsignedInteger SVar11;
  SQUnsignedInteger SVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  SQObject local_58;
  SQInteger local_48;
  SQObject local_40;
  
  local_48 = target;
  if (this->_state == eDead) {
    s = "internal vm error, yielding a dead generator";
  }
  else {
    if (this->_state != eSuspended) {
      SVar12 = v->_top - v->_stackbase;
      this_00 = &this->_stack;
      local_58._type = OT_NULL;
      local_58._unVal.pTable = (SQTable *)0x0;
      sqvector<SQObjectPtr>::resize(this_00,SVar12,(SQObjectPtr *)&local_58);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
      pSVar4 = (v->_stack)._vals;
      pSVar2 = pSVar4 + v->_stackbase;
      uVar5._0_4_ = (pSVar2->super_SQObject)._type;
      uVar5._4_4_ = *(undefined4 *)&(pSVar2->super_SQObject).field_0x4;
      this_01 = (SQObjectValue)pSVar4[v->_stackbase].super_SQObject._unVal.pRefCounted;
      uVar8 = uVar5;
      if (((SQObjectType)uVar5 >> 0x1b & 1) != 0) {
        x = SQRefCounted::GetWeakRef(this_01.pRefCounted,(SQObjectType)uVar5);
        SQObjectPtr::SQObjectPtr((SQObjectPtr *)&local_40,x);
        local_58._type = local_40._type;
        local_58._4_4_ = local_40._4_4_;
        local_58._unVal = local_40._unVal;
        uVar8 = local_58._0_8_;
        this_01 = local_58._unVal;
      }
      local_58._unVal = this_01;
      local_58._0_8_ = uVar8;
      SQObjectPtr::operator=(this_00->_vals,&local_58);
      if (((SQObjectType)uVar5 >> 0x1b & 1) != 0) {
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_40);
      }
      lVar10 = 0x10;
      for (lVar9 = 1; lVar9 < local_48; lVar9 = lVar9 + 1) {
        SQObjectPtr::operator=
                  ((SQObjectPtr *)((long)&(this_00->_vals->super_SQObject)._type + lVar10),
                   (SQObjectPtr *)
                   ((long)&(v->_stack)._vals[v->_stackbase].super_SQObject._type + lVar10));
        lVar10 = lVar10 + 0x10;
      }
      SVar11 = 0;
      if ((long)SVar12 < 1) {
        SVar12 = SVar11;
      }
      while (bVar13 = SVar12 != 0, SVar12 = SVar12 - 1, bVar13) {
        SQObjectPtr::Null((SQObjectPtr *)
                          ((long)&(v->_stack)._vals[v->_stackbase].super_SQObject._type + SVar11));
        SVar11 = SVar11 + 0x10;
      }
      SQVM::CallInfo::operator=(&this->_ci,v->ci);
      (this->_ci)._generator = (SQGenerator *)0x0;
      for (lVar9 = 0; lVar9 < (this->_ci)._etraps; lVar9 = lVar9 + 1) {
        sqvector<SQExceptionTrap>::push_back
                  (&this->_etraps,(v->_etraps)._vals + ((v->_etraps)._size - 1));
        pSVar1 = &(v->_etraps)._size;
        *pSVar1 = *pSVar1 - 1;
        pSVar6 = (this->_etraps)._vals;
        SVar12 = (this->_etraps)._size;
        pSVar3 = pSVar6 + (SVar12 - 1);
        lVar7 = pSVar3->_stacksize;
        lVar10 = v->_stackbase;
        auVar14._8_4_ = (int)lVar10;
        auVar14._0_8_ = lVar10;
        auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
        pSVar6 = pSVar6 + (SVar12 - 1);
        pSVar6->_stackbase = pSVar3->_stackbase - lVar10;
        pSVar6->_stacksize = lVar7 - auVar14._8_8_;
      }
      this->_state = eSuspended;
      return true;
    }
    s = "internal vm error, yielding dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}